

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# utils.c
# Opt level: O3

ssize_t copy_block(int fd_out,int fd_in,size_t nbyte)

{
  ssize_t sVar1;
  size_t nbyte_00;
  size_t sVar2;
  size_t unaff_R13;
  char buffer [1024];
  undefined1 auStack_438 [1032];
  
  if (nbyte == 0) {
    sVar2 = 0;
  }
  else {
    sVar2 = 0;
    do {
      nbyte_00 = 0x400;
      if (nbyte < 0x400) {
        nbyte_00 = nbyte;
      }
      unaff_R13 = read_block(fd_in,auStack_438,nbyte_00);
      if ((long)unaff_R13 < 1) break;
      sVar1 = write_block(fd_out,auStack_438,unaff_R13);
      if (sVar1 < (long)unaff_R13) {
        return -1;
      }
      sVar2 = sVar2 + unaff_R13;
      nbyte = nbyte - unaff_R13;
    } while (nbyte != 0);
  }
  if ((long)unaff_R13 < 0) {
    sVar2 = unaff_R13;
  }
  return sVar2;
}

Assistant:

ssize_t copy_block(int fd_out, int fd_in, size_t nbyte) {
  char buffer[COPY_BLOCK_SIZE];
  ssize_t rd;
  size_t total;

  total = 0;
  while (nbyte > 0 && (rd = read_block(fd_in, buffer, nbyte > sizeof(buffer) ? sizeof(buffer) : nbyte)) > 0) {
    if (write_block(fd_out, buffer, rd) < rd) {
      return -1;
    }
    total += rd;
    nbyte -= rd;
  }
  if (rd < 0) {
    return rd;
  } else {
    return total;
  }
}